

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O3

Error asmjit::X86Logging_formatImmBits(StringBuilder *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  char cVar1;
  uint uVar2;
  Error EVar3;
  uint uVar4;
  char *__s;
  ulong uVar5;
  int iVar6;
  char buf [64];
  
  if (count != 0) {
    uVar5 = 0;
    iVar6 = 0;
    do {
      uVar4 = (bits[uVar5].mask & u8) >> (bits[uVar5].shift & 0x1f);
      if (bits[uVar5].mode == '\x01') {
        __s = buf;
        snprintf(__s,0x40,bits[uVar5].text);
      }
      else {
        if (bits[uVar5].mode != '\0') {
          return 4;
        }
        __s = bits[uVar5].text;
        if (uVar4 != 0) {
          uVar2 = 0;
          do {
            do {
              cVar1 = *__s;
              __s = __s + 1;
            } while (cVar1 != '\0');
            uVar2 = uVar2 + 1;
          } while (uVar2 != uVar4);
        }
      }
      if (*__s != '\0') {
        EVar3 = StringBuilder::_opChar(sb,1,(iVar6 != 0) << 6 | 0x3c);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = StringBuilder::_opString(sb,1,__s,0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        iVar6 = iVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != count);
    if (iVar6 != 0) {
      EVar3 = StringBuilder::_opChar(sb,1,'>');
      return EVar3;
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmBits(StringBuilder& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & static_cast<uint32_t>(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Utils::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, static_cast<unsigned int>(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.appendChar(++n == 1 ? '<' : '|'));
    ASMJIT_PROPAGATE(sb.appendString(str));
  }

  return n ? sb.appendChar('>') : static_cast<Error>(kErrorOk);
}